

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlRegCheckCharacterRange
              (xmlRegAtomType type,int codepoint,int neg,int start,int end,xmlChar *blockName)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 in_register_00000084;
  bool bVar4;
  bool bVar5;
  
  switch(type) {
  case XML_REGEXP_LETTER:
    iVar2 = xmlUCSIsCatL(codepoint);
    return iVar2;
  case XML_REGEXP_LETTER_UPPERCASE:
    iVar2 = xmlUCSIsCatLu(codepoint);
    return iVar2;
  case XML_REGEXP_LETTER_LOWERCASE:
    iVar2 = xmlUCSIsCatLl(codepoint);
    return iVar2;
  case XML_REGEXP_LETTER_TITLECASE:
    iVar2 = xmlUCSIsCatLt(codepoint);
    return iVar2;
  case XML_REGEXP_LETTER_MODIFIER:
    iVar2 = xmlUCSIsCatLm(codepoint);
    return iVar2;
  case XML_REGEXP_LETTER_OTHERS:
    iVar2 = xmlUCSIsCatLo(codepoint);
    return iVar2;
  case XML_REGEXP_MARK:
    iVar2 = xmlUCSIsCatM(codepoint);
    return iVar2;
  case XML_REGEXP_MARK_NONSPACING:
    iVar2 = xmlUCSIsCatMn(codepoint);
    return iVar2;
  case XML_REGEXP_MARK_SPACECOMBINING:
    iVar2 = xmlUCSIsCatMc(codepoint);
    return iVar2;
  case XML_REGEXP_MARK_ENCLOSING:
    iVar2 = xmlUCSIsCatMe(codepoint);
    return iVar2;
  case XML_REGEXP_NUMBER:
    iVar2 = xmlUCSIsCatN(codepoint);
    return iVar2;
  case XML_REGEXP_NUMBER_DECIMAL:
    iVar2 = xmlUCSIsCatNd(codepoint);
    return iVar2;
  case XML_REGEXP_NUMBER_LETTER:
    iVar2 = xmlUCSIsCatNl(codepoint);
    return iVar2;
  case XML_REGEXP_NUMBER_OTHERS:
    iVar2 = xmlUCSIsCatNo(codepoint);
    return iVar2;
  case XML_REGEXP_PUNCT:
    iVar2 = xmlUCSIsCatP(codepoint);
    return iVar2;
  case XML_REGEXP_PUNCT_CONNECTOR:
    iVar2 = xmlUCSIsCatPc(codepoint);
    return iVar2;
  case XML_REGEXP_PUNCT_DASH:
    iVar2 = xmlUCSIsCatPd(codepoint);
    return iVar2;
  case XML_REGEXP_PUNCT_OPEN:
    iVar2 = xmlUCSIsCatPs(codepoint);
    return iVar2;
  case XML_REGEXP_PUNCT_CLOSE:
    iVar2 = xmlUCSIsCatPe(codepoint);
    return iVar2;
  case XML_REGEXP_PUNCT_INITQUOTE:
    iVar2 = xmlUCSIsCatPi(codepoint);
    return iVar2;
  case XML_REGEXP_PUNCT_FINQUOTE:
    iVar2 = xmlUCSIsCatPf(codepoint);
    return iVar2;
  case XML_REGEXP_PUNCT_OTHERS:
    iVar2 = xmlUCSIsCatPo(codepoint);
    return iVar2;
  case XML_REGEXP_SEPAR:
    iVar2 = xmlUCSIsCatZ(codepoint);
    return iVar2;
  case XML_REGEXP_SEPAR_SPACE:
    iVar2 = xmlUCSIsCatZs(codepoint);
    return iVar2;
  case XML_REGEXP_SEPAR_LINE:
    iVar2 = xmlUCSIsCatZl(codepoint);
    return iVar2;
  case XML_REGEXP_SEPAR_PARA:
    iVar2 = xmlUCSIsCatZp(codepoint);
    return iVar2;
  case XML_REGEXP_SYMBOL:
    iVar2 = xmlUCSIsCatS(codepoint);
    return iVar2;
  case XML_REGEXP_SYMBOL_MATH:
    iVar2 = xmlUCSIsCatSm(codepoint);
    return iVar2;
  case XML_REGEXP_SYMBOL_CURRENCY:
    iVar2 = xmlUCSIsCatSc(codepoint);
    return iVar2;
  case XML_REGEXP_SYMBOL_MODIFIER:
    iVar2 = xmlUCSIsCatSk(codepoint);
    return iVar2;
  case XML_REGEXP_SYMBOL_OTHERS:
    iVar2 = xmlUCSIsCatSo(codepoint);
    return iVar2;
  case XML_REGEXP_OTHER:
    iVar2 = xmlUCSIsCatC(codepoint);
    return iVar2;
  case XML_REGEXP_OTHER_CONTROL:
    iVar2 = xmlUCSIsCatCc(codepoint);
    return iVar2;
  case XML_REGEXP_OTHER_FORMAT:
    iVar2 = xmlUCSIsCatCf(codepoint);
    return iVar2;
  case XML_REGEXP_OTHER_PRIVATE:
    iVar2 = xmlUCSIsCatCo(codepoint);
    return iVar2;
  case XML_REGEXP_OTHER_NA:
LAB_001a5c70:
    return 0;
  case XML_REGEXP_BLOCK_NAME:
    iVar2 = xmlUCSIsBlock(codepoint,(char *)CONCAT44(in_register_00000084,end));
    return iVar2;
  }
  bVar5 = false;
  bVar4 = false;
  bVar1 = false;
  switch(type) {
  case XML_REGEXP_EPSILON:
  case XML_REGEXP_RANGES:
  case XML_REGEXP_SUBREG:
  case XML_REGEXP_STRING:
    return -1;
  case XML_REGEXP_CHARVAL:
    bVar5 = neg <= codepoint;
    bVar4 = codepoint <= start;
    goto LAB_001a5c4e;
  case XML_REGEXP_ANYCHAR:
    bVar5 = codepoint != 10;
    bVar4 = codepoint != 0xd;
LAB_001a5c4e:
    return (uint)(byte)(bVar4 & bVar5);
  case XML_REGEXP_ANYSPACE:
    goto switchD_001a58c2_caseD_7;
  case XML_REGEXP_NOTSPACE:
    bVar5 = true;
switchD_001a58c2_caseD_7:
    if (((uint)codepoint < 0xe) && ((0x2600U >> (codepoint & 0x1fU) & 1) != 0)) {
      uVar3 = 1;
    }
    else {
      bVar4 = codepoint == 0x20;
LAB_001a5c7c:
      uVar3 = (uint)bVar4;
    }
LAB_001a5c62:
    if (!bVar5) {
      return uVar3;
    }
    return (uint)(uVar3 == 0);
  case XML_REGEXP_INITNAME:
    goto switchD_001a58c2_caseD_9;
  case XML_REGEXP_NOTINITNAME:
    bVar5 = true;
switchD_001a58c2_caseD_9:
    if (codepoint < 0x100) {
      uVar3 = 1;
      if ((((codepoint - 0xc0U < 0x17) || ((codepoint & 0xffffffdfU) - 0x41 < 0x1a)) ||
          (codepoint == 0x5f)) || ((0xf7 < codepoint || (codepoint - 0xd8U < 0x1f))))
      goto LAB_001a5c62;
    }
    else {
      iVar2 = xmlCharInRange(codepoint,&xmlIsBaseCharGroup);
      uVar3 = 1;
      if ((iVar2 != 0) ||
         ((codepoint - 0x3021U < 9 || codepoint - 0x4e00U < 0x51a6) || codepoint == 0x3007))
      goto LAB_001a5c62;
    }
    bVar4 = codepoint == 0x3a;
    goto LAB_001a5c7c;
  case XML_REGEXP_NAMECHAR:
    goto switchD_001a58c2_caseD_b;
  case XML_REGEXP_NOTNAMECHAR:
    bVar4 = true;
switchD_001a58c2_caseD_b:
    bVar5 = bVar4;
    if (codepoint < 0x100) {
      uVar3 = 1;
      if (((codepoint - 0xc0U < 0x17) || ((codepoint & 0xffffffdfU) - 0x41 < 0x1a)) ||
         ((codepoint - 0x30U < 10 || ((0xf7 < codepoint || (codepoint - 0xd8U < 0x1f))))))
      goto LAB_001a5c62;
    }
    else {
      iVar2 = xmlCharInRange(codepoint,&xmlIsBaseCharGroup);
      uVar3 = 1;
      if (((iVar2 != 0) ||
          ((codepoint - 0x3021U < 9 || codepoint - 0x4e00U < 0x51a6) || codepoint == 0x3007)) ||
         (iVar2 = xmlCharInRange(codepoint,&xmlIsDigitGroup), iVar2 != 0)) goto LAB_001a5c62;
    }
    uVar3 = 1;
    if ((0x32 < codepoint - 0x2dU) ||
       ((0x4000000002003U >> ((ulong)(codepoint - 0x2dU) & 0x3f) & 1) == 0)) {
      if (codepoint < 0x100) {
        bVar4 = codepoint == 0xb7;
      }
      else {
        iVar2 = xmlCharInRange(codepoint,&xmlIsCombiningGroup);
        if (iVar2 != 0) goto LAB_001a5c62;
        iVar2 = xmlCharInRange(codepoint,&xmlIsExtenderGroup);
        bVar4 = iVar2 != 0;
      }
      uVar3 = (uint)bVar4;
    }
    goto LAB_001a5c62;
  case XML_REGEXP_DECIMAL:
    goto switchD_001a58c2_caseD_d;
  case XML_REGEXP_NOTDECIMAL:
    bVar1 = true;
switchD_001a58c2_caseD_d:
    bVar5 = bVar1;
    uVar3 = xmlUCSIsCatNd(codepoint);
    goto LAB_001a5c62;
  case XML_REGEXP_REALCHAR:
    bVar1 = true;
  case XML_REGEXP_NOTREALCHAR:
    bVar5 = bVar1;
    uVar3 = xmlUCSIsCatP(codepoint);
    if ((uVar3 == 0) && (uVar3 = xmlUCSIsCatZ(codepoint), uVar3 == 0)) {
      uVar3 = xmlUCSIsCatC(codepoint);
    }
    goto LAB_001a5c62;
  default:
    goto LAB_001a5c70;
  }
}

Assistant:

static int
xmlRegCheckCharacterRange(xmlRegAtomType type, int codepoint, int neg,
	                  int start, int end, const xmlChar *blockName) {
    int ret = 0;

    switch (type) {
        case XML_REGEXP_STRING:
        case XML_REGEXP_SUBREG:
        case XML_REGEXP_RANGES:
        case XML_REGEXP_EPSILON:
	    return(-1);
        case XML_REGEXP_ANYCHAR:
	    ret = ((codepoint != '\n') && (codepoint != '\r'));
	    break;
        case XML_REGEXP_CHARVAL:
	    ret = ((codepoint >= start) && (codepoint <= end));
	    break;
        case XML_REGEXP_NOTSPACE:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_ANYSPACE:
	    ret = ((codepoint == '\n') || (codepoint == '\r') ||
		   (codepoint == '\t') || (codepoint == ' '));
	    break;
        case XML_REGEXP_NOTINITNAME:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_INITNAME:
	    ret = (IS_LETTER(codepoint) ||
		   (codepoint == '_') || (codepoint == ':'));
	    break;
        case XML_REGEXP_NOTNAMECHAR:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_NAMECHAR:
	    ret = (IS_LETTER(codepoint) || IS_DIGIT(codepoint) ||
		   (codepoint == '.') || (codepoint == '-') ||
		   (codepoint == '_') || (codepoint == ':') ||
		   IS_COMBINING(codepoint) || IS_EXTENDER(codepoint));
	    break;
        case XML_REGEXP_NOTDECIMAL:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_DECIMAL:
	    ret = xmlUCSIsCatNd(codepoint);
	    break;
        case XML_REGEXP_REALCHAR:
	    neg = !neg;
            /* Falls through. */
        case XML_REGEXP_NOTREALCHAR:
	    ret = xmlUCSIsCatP(codepoint);
	    if (ret == 0)
		ret = xmlUCSIsCatZ(codepoint);
	    if (ret == 0)
		ret = xmlUCSIsCatC(codepoint);
	    break;
        case XML_REGEXP_LETTER:
	    ret = xmlUCSIsCatL(codepoint);
	    break;
        case XML_REGEXP_LETTER_UPPERCASE:
	    ret = xmlUCSIsCatLu(codepoint);
	    break;
        case XML_REGEXP_LETTER_LOWERCASE:
	    ret = xmlUCSIsCatLl(codepoint);
	    break;
        case XML_REGEXP_LETTER_TITLECASE:
	    ret = xmlUCSIsCatLt(codepoint);
	    break;
        case XML_REGEXP_LETTER_MODIFIER:
	    ret = xmlUCSIsCatLm(codepoint);
	    break;
        case XML_REGEXP_LETTER_OTHERS:
	    ret = xmlUCSIsCatLo(codepoint);
	    break;
        case XML_REGEXP_MARK:
	    ret = xmlUCSIsCatM(codepoint);
	    break;
        case XML_REGEXP_MARK_NONSPACING:
	    ret = xmlUCSIsCatMn(codepoint);
	    break;
        case XML_REGEXP_MARK_SPACECOMBINING:
	    ret = xmlUCSIsCatMc(codepoint);
	    break;
        case XML_REGEXP_MARK_ENCLOSING:
	    ret = xmlUCSIsCatMe(codepoint);
	    break;
        case XML_REGEXP_NUMBER:
	    ret = xmlUCSIsCatN(codepoint);
	    break;
        case XML_REGEXP_NUMBER_DECIMAL:
	    ret = xmlUCSIsCatNd(codepoint);
	    break;
        case XML_REGEXP_NUMBER_LETTER:
	    ret = xmlUCSIsCatNl(codepoint);
	    break;
        case XML_REGEXP_NUMBER_OTHERS:
	    ret = xmlUCSIsCatNo(codepoint);
	    break;
        case XML_REGEXP_PUNCT:
	    ret = xmlUCSIsCatP(codepoint);
	    break;
        case XML_REGEXP_PUNCT_CONNECTOR:
	    ret = xmlUCSIsCatPc(codepoint);
	    break;
        case XML_REGEXP_PUNCT_DASH:
	    ret = xmlUCSIsCatPd(codepoint);
	    break;
        case XML_REGEXP_PUNCT_OPEN:
	    ret = xmlUCSIsCatPs(codepoint);
	    break;
        case XML_REGEXP_PUNCT_CLOSE:
	    ret = xmlUCSIsCatPe(codepoint);
	    break;
        case XML_REGEXP_PUNCT_INITQUOTE:
	    ret = xmlUCSIsCatPi(codepoint);
	    break;
        case XML_REGEXP_PUNCT_FINQUOTE:
	    ret = xmlUCSIsCatPf(codepoint);
	    break;
        case XML_REGEXP_PUNCT_OTHERS:
	    ret = xmlUCSIsCatPo(codepoint);
	    break;
        case XML_REGEXP_SEPAR:
	    ret = xmlUCSIsCatZ(codepoint);
	    break;
        case XML_REGEXP_SEPAR_SPACE:
	    ret = xmlUCSIsCatZs(codepoint);
	    break;
        case XML_REGEXP_SEPAR_LINE:
	    ret = xmlUCSIsCatZl(codepoint);
	    break;
        case XML_REGEXP_SEPAR_PARA:
	    ret = xmlUCSIsCatZp(codepoint);
	    break;
        case XML_REGEXP_SYMBOL:
	    ret = xmlUCSIsCatS(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_MATH:
	    ret = xmlUCSIsCatSm(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_CURRENCY:
	    ret = xmlUCSIsCatSc(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_MODIFIER:
	    ret = xmlUCSIsCatSk(codepoint);
	    break;
        case XML_REGEXP_SYMBOL_OTHERS:
	    ret = xmlUCSIsCatSo(codepoint);
	    break;
        case XML_REGEXP_OTHER:
	    ret = xmlUCSIsCatC(codepoint);
	    break;
        case XML_REGEXP_OTHER_CONTROL:
	    ret = xmlUCSIsCatCc(codepoint);
	    break;
        case XML_REGEXP_OTHER_FORMAT:
	    ret = xmlUCSIsCatCf(codepoint);
	    break;
        case XML_REGEXP_OTHER_PRIVATE:
	    ret = xmlUCSIsCatCo(codepoint);
	    break;
        case XML_REGEXP_OTHER_NA:
	    /* ret = xmlUCSIsCatCn(codepoint); */
	    /* Seems it doesn't exist anymore in recent Unicode releases */
	    ret = 0;
	    break;
        case XML_REGEXP_BLOCK_NAME:
	    ret = xmlUCSIsBlock(codepoint, (const char *) blockName);
	    break;
    }
    if (neg)
	return(!ret);
    return(ret);
}